

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ImGuiContext *pIVar6;
  ImGuiPopupData *__dest;
  ImGuiWindow *pIVar7;
  ImGuiContext *ctx;
  uint uVar8;
  ulong uVar9;
  
  pIVar6 = GImGui;
  if ((remaining < 0) ||
     (uVar5 = (ulong)(uint)remaining, (GImGui->OpenPopupStack).Size <= remaining)) {
    __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1f5b,"void ImGui::ClosePopupToLevel(int, bool)");
  }
  pIVar3 = (GImGui->OpenPopupStack).Data;
  pIVar7 = pIVar3[uVar5].Window;
  pIVar4 = pIVar3[uVar5].SourceWindow;
  iVar2 = (GImGui->OpenPopupStack).Capacity;
  if (iVar2 < remaining) {
    if (iVar2 == 0) {
      uVar8 = 8;
    }
    else {
      uVar8 = iVar2 / 2 + iVar2;
    }
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 <= remaining) {
      uVar9 = uVar5;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar9 * 0x30,GImAllocatorUserData);
    pIVar3 = (pIVar6->OpenPopupStack).Data;
    if (pIVar3 != (ImGuiPopupData *)0x0) {
      memcpy(__dest,pIVar3,(long)(pIVar6->OpenPopupStack).Size * 0x30);
      pIVar3 = (pIVar6->OpenPopupStack).Data;
      if ((pIVar3 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (pIVar6->OpenPopupStack).Data = __dest;
    (pIVar6->OpenPopupStack).Capacity = (int)uVar9;
  }
  (pIVar6->OpenPopupStack).Size = remaining;
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if (pIVar4 == (ImGuiWindow *)0x0) {
    pIVar7 = (ImGuiWindow *)0x0;
  }
  else {
    if (pIVar7 != (ImGuiWindow *)0x0 && pIVar4->WasActive == false) {
      FocusTopMostWindowUnderOne(pIVar7,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar6->NavLayer != ImGuiNavLayer_Main) ||
        (pIVar7 = pIVar4->NavLastChildNavWindow, pIVar7 == (ImGuiWindow *)0x0)) ||
       (pIVar7->WasActive == false)) {
      pIVar7 = pIVar4;
    }
  }
  FocusWindow(pIVar7);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}